

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> * __thiscall
cmGeneratorTarget::GetUtilityItems(cmGeneratorTarget *this)

{
  cmLocalGenerator *this_00;
  bool bVar1;
  reference pbVar2;
  cmLinkItem local_58;
  cmGeneratorTarget *local_30;
  cmGeneratorTarget *gt;
  _Self local_20;
  const_iterator i;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *utilities;
  cmGeneratorTarget *this_local;
  
  if ((this->UtilityItemsDone & 1U) == 0) {
    this->UtilityItemsDone = true;
    i._M_node = (_Base_ptr)GetUtilities_abi_cxx11_(this);
    local_20._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)i._M_node);
    while( true ) {
      gt = (cmGeneratorTarget *)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)i._M_node);
      bVar1 = std::operator!=(&local_20,(_Self *)&gt);
      if (!bVar1) break;
      this_00 = this->LocalGenerator;
      pbVar2 = std::
               _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_20);
      local_30 = cmLocalGenerator::FindGeneratorTargetToUse(this_00,pbVar2);
      pbVar2 = std::
               _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_20);
      cmLinkItem::cmLinkItem(&local_58,pbVar2,local_30);
      std::set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>::insert
                (&this->UtilityItems,&local_58);
      cmLinkItem::~cmLinkItem(&local_58);
      std::
      _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&local_20);
    }
  }
  return &this->UtilityItems;
}

Assistant:

std::set<cmLinkItem> const& cmGeneratorTarget::GetUtilityItems() const
{
  if (!this->UtilityItemsDone) {
    this->UtilityItemsDone = true;
    std::set<std::string> const& utilities = this->GetUtilities();
    for (std::set<std::string>::const_iterator i = utilities.begin();
         i != utilities.end(); ++i) {
      cmGeneratorTarget* gt =
        this->LocalGenerator->FindGeneratorTargetToUse(*i);
      this->UtilityItems.insert(cmLinkItem(*i, gt));
    }
  }
  return this->UtilityItems;
}